

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

int Sbc_ManWlcNodes(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGia2Out,int nOuts)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Wlc_Obj_t *p_01;
  char *pcVar6;
  Vec_Int_t *vMatched;
  int iObjFound;
  int nBits;
  int iFirst;
  int iLitOut;
  int iLitGia;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  int nOuts_local;
  Vec_Int_t *vGia2Out_local;
  Gia_Man_t *p_local;
  Wlc_Ntk_t *pNtk_local;
  
  vMatched._4_4_ = -1;
  p_00 = Vec_IntAlloc(100);
  iLitGia = 1;
  do {
    iVar1 = Wlc_NtkObjNumMax(pNtk);
    if (iVar1 <= iLitGia) {
LAB_003bc3df:
      Vec_IntFree(p_00);
      return vMatched._4_4_;
    }
    p_01 = Wlc_NtkObj(pNtk,iLitGia);
    iVar1 = Vec_IntEntry(&pNtk->vCopies,iLitGia);
    uVar2 = Wlc_ObjRange(p_01);
    Vec_IntClear(p_00);
    for (iLitOut = 0; iLitOut < (int)uVar2; iLitOut = iLitOut + 1) {
      iVar3 = Vec_IntEntry(&pNtk->vBits,iVar1 + iLitOut);
      iVar4 = Abc_Lit2Var(iVar3);
      iVar4 = Vec_IntEntry(vGia2Out,iVar4);
      if (iVar4 != -1) {
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(iVar4,iVar3);
        iVar4 = Wlc_ObjId(pNtk,p_01);
        pcVar6 = Wlc_ObjName(pNtk,iVar4);
        uVar5 = Abc_Lit2Var(iVar3);
        iVar4 = Abc_LitIsCompl(iVar3);
        printf("Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n",
               (ulong)(uint)iLitGia,pcVar6,(ulong)(uint)iLitOut,(ulong)uVar2,(ulong)uVar5,iVar4);
        iVar3 = Abc_Lit2Var(iVar3);
        Vec_IntPushOrder(p_00,iVar3);
      }
    }
    iVar1 = Vec_IntSize(p_00);
    if (0 < iVar1) {
      printf("\n");
    }
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 == nOuts) {
      vMatched._4_4_ = iLitGia;
      printf("Found object %d with all bits matched.\n",(ulong)(uint)iLitGia);
      goto LAB_003bc3df;
    }
    iLitGia = iLitGia + 1;
  } while( true );
}

Assistant:

int Sbc_ManWlcNodes( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGia2Out, int nOuts )
{
    Wlc_Obj_t * pObj;  
    int i, k, iLitGia, iLitOut, iFirst, nBits, iObjFound = -1;
    Vec_Int_t * vMatched = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        Vec_IntClear( vMatched );
        for ( k = 0; k < nBits; k++ )
        {
            iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            iLitOut = Vec_IntEntry( vGia2Out, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n", 
                i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits, Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut) );
            Vec_IntPushOrder( vMatched, Abc_Lit2Var(iLitOut) );
        }
        if ( Vec_IntSize(vMatched) > 0 )
            printf( "\n" );
        if ( Vec_IntSize(vMatched) == nOuts )
        {
            if ( iObjFound == -1 )
                iObjFound = i;
            printf( "Found object %d with all bits matched.\n", i );
            /*
            for ( k = nBits-2; k < nBits; k++ )
            {
                iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
                {
                    word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
                    Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
                }
            }
            */
            break;
        }
    }
    Vec_IntFree( vMatched );
    return iObjFound;
}